

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O1

void EvalCondition(void)

{
  tokentype tVar1;
  int x;
  addressrec aVar2;
  addressrec op2;
  
  tVar1 = actionpop();
  aVar2 = getaddress(tVar1);
  x = actionpop();
  tVar1 = actionpop();
  op2 = getaddress(tVar1);
  aVar2 = GenArithQuad(op2,opsub,aVar2);
  actionpush(aVar2.opnd);
  actionpush(x);
  return;
}

Assistant:

void	EvalCondition(void)
{
    int	tokoptor;
    struct addressrec	op1, op2, op3;
    
    op3 = getaddress(actionpop());
    tokoptor = actionpop();
    op2 = getaddress(actionpop());
    op1 = GenArithQuad(op2, opsub, op3);
    actionpush(op1.opnd);
    actionpush(tokoptor);
}